

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getpass.c
# Opt level: O2

_Bool ttyecho(_Bool enable,int fd)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,enable) != 0) {
    iVar1 = tcsetattr(fd,2,(termios *)&ttyecho::withecho);
    return SUB41(iVar1,0);
  }
  tcgetattr(fd,(termios *)&ttyecho::withecho);
  ttyecho::noecho.c_iflag = ttyecho::withecho.c_iflag;
  ttyecho::noecho.c_oflag = ttyecho::withecho.c_oflag;
  ttyecho::noecho.c_line = ttyecho::withecho.c_line;
  ttyecho::noecho.c_cc[0] = ttyecho::withecho.c_cc[0];
  ttyecho::noecho.c_cc[1] = ttyecho::withecho.c_cc[1];
  ttyecho::noecho.c_cc[2] = ttyecho::withecho.c_cc[2];
  ttyecho::noecho.c_cc[3] = ttyecho::withecho.c_cc[3];
  ttyecho::noecho.c_cc[4] = ttyecho::withecho.c_cc[4];
  ttyecho::noecho.c_cc[5] = ttyecho::withecho.c_cc[5];
  ttyecho::noecho.c_cc[6] = ttyecho::withecho.c_cc[6];
  ttyecho::noecho.c_cc[7] = ttyecho::withecho.c_cc[7];
  ttyecho::noecho.c_cc[8] = ttyecho::withecho.c_cc[8];
  ttyecho::noecho.c_cc[9] = ttyecho::withecho.c_cc[9];
  ttyecho::noecho.c_cc[10] = ttyecho::withecho.c_cc[10];
  ttyecho::noecho.c_cc[0xb] = ttyecho::withecho.c_cc[0xb];
  ttyecho::noecho.c_cc[0xc] = ttyecho::withecho.c_cc[0xc];
  ttyecho::noecho.c_cc[0xd] = ttyecho::withecho.c_cc[0xd];
  ttyecho::noecho.c_cc[0xe] = ttyecho::withecho.c_cc[0xe];
  ttyecho::noecho.c_cc[0xf] = ttyecho::withecho.c_cc[0xf];
  ttyecho::noecho.c_cc[0x10] = ttyecho::withecho.c_cc[0x10];
  ttyecho::noecho.c_cc[0x11] = ttyecho::withecho.c_cc[0x11];
  ttyecho::noecho.c_cc[0x12] = ttyecho::withecho.c_cc[0x12];
  ttyecho::noecho.c_cc[0x13] = ttyecho::withecho.c_cc[0x13];
  ttyecho::noecho.c_cc[0x14] = ttyecho::withecho.c_cc[0x14];
  ttyecho::noecho.c_cc[0x15] = ttyecho::withecho.c_cc[0x15];
  ttyecho::noecho.c_cc[0x16] = ttyecho::withecho.c_cc[0x16];
  ttyecho::noecho.c_cc[0x17] = ttyecho::withecho.c_cc[0x17];
  ttyecho::noecho.c_cc[0x18] = ttyecho::withecho.c_cc[0x18];
  ttyecho::noecho.c_cc[0x19] = ttyecho::withecho.c_cc[0x19];
  ttyecho::noecho.c_cc[0x1a] = ttyecho::withecho.c_cc[0x1a];
  ttyecho::noecho.c_cc[0x1b] = ttyecho::withecho.c_cc[0x1b];
  ttyecho::noecho.c_cc[0x1c] = ttyecho::withecho.c_cc[0x1c];
  ttyecho::noecho.c_cc[0x1d] = ttyecho::withecho.c_cc[0x1d];
  ttyecho::noecho.c_cc[0x1e] = ttyecho::withecho.c_cc[0x1e];
  ttyecho::noecho.c_cc[0x1f] = ttyecho::withecho.c_cc[0x1f];
  ttyecho::noecho._49_3_ = ttyecho::withecho._49_3_;
  ttyecho::noecho.c_ispeed = ttyecho::withecho.c_ispeed;
  ttyecho::noecho.c_ospeed = ttyecho::withecho.c_ospeed;
  ttyecho::noecho._8_8_ = ttyecho::withecho._8_8_ & 0xfffffff7ffffffff;
  iVar1 = tcsetattr(fd,0,(termios *)&ttyecho::noecho);
  return SUB41(iVar1,0);
}

Assistant:

static bool ttyecho(bool enable, int fd)
{
#ifdef struct_term
  static struct_term withecho;
  static struct_term noecho;
#endif
  if(!enable) {
    /* disable echo by extracting the current 'withecho' mode and remove the
       ECHO bit and set back the struct */
#ifdef HAVE_TERMIOS_H
    tcgetattr(fd, &withecho);
    noecho = withecho;
    noecho.c_lflag &= ~ECHO;
    tcsetattr(fd, TCSANOW, &noecho);
#elif defined(HAVE_TERMIO_H)
    ioctl(fd, TCGETA, &withecho);
    noecho = withecho;
    noecho.c_lflag &= ~ECHO;
    ioctl(fd, TCSETA, &noecho);
#else
    /* neither HAVE_TERMIO_H nor HAVE_TERMIOS_H, we can't disable echo! */
    (void)fd;
    return FALSE; /* not disabled */
#endif
    return TRUE; /* disabled */
  }
  /* re-enable echo, assumes we disabled it before (and set the structs we
     now use to reset the terminal status) */
#ifdef HAVE_TERMIOS_H
  tcsetattr(fd, TCSAFLUSH, &withecho);
#elif defined(HAVE_TERMIO_H)
  ioctl(fd, TCSETA, &withecho);
#else
  return FALSE; /* not enabled */
#endif
  return TRUE; /* enabled */
}